

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_enlarge_face(REF_CAVITY ref_cavity,REF_INT face)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_GRID pRVar3;
  REF_NODE pRVar4;
  REF_ADJ pRVar5;
  REF_DBL *pRVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  REF_INT tet1;
  REF_INT tet0;
  REF_BOOL have_cell1;
  REF_BOOL have_cell0;
  REF_INT face_nodes [4];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  if ((-1 < face) && (face < ref_cavity->maxface)) {
    pRVar2 = ref_cavity->f2n;
    uVar8 = (ulong)(uint)(face * 3);
    local_38 = pRVar2[uVar8];
    if (local_38 != 0xffffffff) {
      pRVar3 = ref_cavity->ref_grid;
      pRVar4 = pRVar3->node;
      lVar12 = 0;
      do {
        if (pRVar4->ref_mpi->id != pRVar4->part[pRVar2[uVar8 + lVar12]]) {
          ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
          return 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        iVar1 = pRVar2[uVar8 + lVar12];
        lVar10 = (long)iVar1;
        if ((-1 < lVar10) &&
           (((((pRVar5 = pRVar3->cell[9]->ref_adj, iVar1 < pRVar5->nnode &&
               (pRVar5->first[lVar10] != -1)) ||
              ((pRVar5 = pRVar3->cell[10]->ref_adj, iVar1 < pRVar5->nnode &&
               (pRVar5->first[lVar10] != -1)))) ||
             ((pRVar5 = pRVar3->cell[0xb]->ref_adj, iVar1 < pRVar5->nnode &&
              (pRVar5->first[lVar10] != -1)))) ||
            ((pRVar5 = pRVar3->cell[6]->ref_adj, iVar1 < pRVar5->nnode &&
             (pRVar5->first[lVar10] != -1)))))) {
          ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
          return 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_34 = pRVar2[uVar8 + 1];
      local_30 = pRVar2[uVar8 + 2];
      local_2c = local_38;
      uVar7 = ref_cell_with_face(pRVar3->cell[8],(REF_INT *)&local_38,&local_44,&local_48);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x813,"ref_cavity_enlarge_face",(ulong)uVar7,"found too many tets with face_nodes");
        lVar12 = (long)(int)local_38;
        pRVar6 = pRVar4->real;
        printf("%d face_nodes %d %d %d %d\n%f %f %f\n",pRVar6[lVar12 * 0xf],pRVar6[lVar12 * 0xf + 1]
               ,pRVar6[lVar12 * 0xf + 2],(ulong)(uint)face,lVar12,(ulong)local_34,(ulong)local_30,
               (ulong)local_2c);
        ref_cavity_tec(ref_cavity,"ref_cavity_too_many_tet.tec");
        return uVar7;
      }
      if ((local_44 != -1) && (local_48 != -1)) {
        uVar7 = ref_list_contains(ref_cavity->tet_list,local_44,&local_3c);
        if (uVar7 == 0) {
          uVar7 = ref_list_contains(ref_cavity->tet_list,local_48,&local_40);
          if (uVar7 == 0) {
            if ((local_3c == 0) || (uVar7 = ref_cavity_add_tet(ref_cavity,local_48), uVar7 == 0)) {
              if (local_40 == 0) {
                return 0;
              }
              uVar7 = ref_cavity_add_tet(ref_cavity,local_44);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x822,"ref_cavity_enlarge_face",(ulong)uVar7,"add c0");
                return uVar7;
              }
              return 0;
            }
            pcVar11 = "add c1";
            uVar9 = 0x821;
          }
          else {
            pcVar11 = "cell1";
            uVar9 = 0x820;
          }
        }
        else {
          pcVar11 = "cell0";
          uVar9 = 0x81e;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar9,"ref_cavity_enlarge_face",(ulong)uVar7,pcVar11);
        return uVar7;
      }
      ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
      return 0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x7f0,
         "ref_cavity_enlarge_face","invalid face");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_face(REF_CAVITY ref_cavity,
                                           REF_INT face) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT face_node, face_nodes[4], node;
  REF_BOOL have_cell0, have_cell1;
  REF_INT tet0, tet1;

  RAS(ref_cavity_valid_face(ref_cavity, face), "invalid face");

  /* make sure all face nodes are owned */
  each_ref_cavity_face_node(ref_cavity, face_node) {
    node = ref_cavity_f2n(ref_cavity, face_node, face);
    if (!ref_node_owned(ref_node, node)) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  /* make sure all face nodes are tet */
  each_ref_cavity_face_node(ref_cavity, face_node) {
    node = ref_cavity_f2n(ref_cavity, face_node, face);
    if (!(ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node) &&
          ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node))) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
      return REF_SUCCESS;
    }
  }

  face_nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
  face_nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
  face_nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
  face_nodes[3] = face_nodes[0];
  RSB(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0, &tet1),
      "found too many tets with face_nodes", {
        printf("%d face_nodes %d %d %d %d\n%f %f %f\n", face, face_nodes[0],
               face_nodes[1], face_nodes[2], face_nodes[3],
               ref_node_xyz(ref_node, 0, face_nodes[0]),
               ref_node_xyz(ref_node, 1, face_nodes[0]),
               ref_node_xyz(ref_node, 2, face_nodes[0]));
        ref_cavity_tec(ref_cavity, "ref_cavity_too_many_tet.tec");
      });
  if (REF_EMPTY == tet0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }
  if (REF_EMPTY == tet1) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet0, &have_cell0),
      "cell0");
  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet1, &have_cell1),
      "cell1");
  if (have_cell0) RSS(ref_cavity_add_tet(ref_cavity, tet1), "add c1");
  if (have_cell1) RSS(ref_cavity_add_tet(ref_cavity, tet0), "add c0");

  return REF_SUCCESS;
}